

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O3

void Abc_NtkPrecomputeCellPairsTest(void)

{
  uint uVar1;
  Mio_Cell2_t *pCells;
  Vec_Int_t *vInfo;
  Vec_Int_t *__ptr;
  int nCells;
  int local_2c;
  
  pCells = Mio_CollectRootsNewDefault2(6,&local_2c,0);
  vInfo = Abc_NtkPrecomputeCellPairs(pCells,local_2c);
  uVar1 = Abc_NtkPrecomputePrint(pCells,local_2c,vInfo);
  __ptr = Abc_NtkPrecomputeFirsts(pCells,local_2c);
  printf("Used records = %d.  All records = %d.\n",(ulong)uVar1,(ulong)(vInfo->nSize / 3 - uVar1));
  if (local_2c == __ptr->nSize) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (vInfo->pArray != (int *)0x0) {
      free(vInfo->pArray);
    }
    free(vInfo);
    if (pCells != (Mio_Cell2_t *)0x0) {
      free(pCells);
    }
    return;
  }
  __assert_fail("nCells == Vec_IntSize(vFirst)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                ,0xac,"void Abc_NtkPrecomputeCellPairsTest()");
}

Assistant:

void Abc_NtkPrecomputeCellPairsTest()
{
    int nCells;
    Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
    Vec_Int_t * vInfo = Abc_NtkPrecomputeCellPairs( pCells, nCells );
    int nRecUsed = Abc_NtkPrecomputePrint( pCells, nCells, vInfo );
    // iterate through the cells
    Vec_Int_t * vFirst = Abc_NtkPrecomputeFirsts( pCells, nCells );
    printf( "Used records = %d.  All records = %d.\n", nRecUsed, Vec_IntSize(vInfo)/3 - nRecUsed );
    assert( nCells == Vec_IntSize(vFirst) );
    Vec_IntFree( vFirst );
    Vec_IntFree( vInfo );
    ABC_FREE( pCells );
}